

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTDMT_initCStream_internal
                 (ZSTDMT_CCtx *mtctx,void *dict,size_t dictSize,
                 ZSTD_dictContentType_e dictContentType,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 unsigned_long_long pledgedSrcSize)

{
  ldmState_t *ldmState;
  U32 UVar1;
  void *pvVar2;
  pthread_mutex_t *ppVar3;
  ZSTD_freeFunction p_Var4;
  ZSTD_allocFunction p_Var5;
  BYTE *pBVar6;
  ZSTD_customMem ZVar7;
  ZSTD_customMem cMem;
  undefined4 uVar8;
  ZSTD_strategy ZVar9;
  undefined4 in_EAX;
  int iVar10;
  int iVar11;
  size_t sVar12;
  ZSTD_CDict *pZVar13;
  ZSTDMT_jobDescription *pZVar14;
  ZSTDMT_bufferPool *pZVar15;
  ZSTDMT_CCtxPool *pZVar16;
  ulong uVar17;
  BYTE *pBVar18;
  size_t __size;
  size_t __size_00;
  ldmEntry_t *__ptr;
  ldmEntry_t *plVar19;
  byte bVar20;
  long lVar21;
  ZSTD_format_e ZVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  U32 UVar26;
  long lVar27;
  BYTE *pBVar28;
  uint uVar29;
  uint uVar31;
  uint uVar32;
  undefined1 in_XMM0 [16];
  undefined1 auVar30 [16];
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  undefined8 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  void *in_stack_fffffffffffffe78;
  undefined1 local_108 [96];
  undefined1 local_a8 [16];
  undefined8 local_98;
  ZSTD_allocFunction local_70;
  ZSTD_freeFunction p_Stack_68;
  void *local_60;
  
  ZVar9 = params.cParams.strategy;
  iVar11 = params.nbWorkers;
  auVar30 = pmovsxbd(in_XMM0,0xe1e1e1e0);
  uVar34 = params.cParams.windowLog;
  uVar29 = auVar30._0_4_ + uVar34;
  uVar23 = params.cParams.chainLog;
  uVar31 = auVar30._4_4_ + uVar23;
  uVar32 = auVar30._8_4_ + params.cParams.hashLog;
  uVar33 = auVar30._12_4_ + params.cParams.searchLog;
  auVar30 = pmovsxbd(params.cParams._0_16_,0xe1e6e6e9);
  uVar35 = auVar30._0_4_;
  uVar36 = auVar30._4_4_;
  uVar37 = auVar30._8_4_;
  uVar38 = auVar30._12_4_;
  auVar30._0_4_ = -(uint)(((uVar29 < uVar35) * uVar29 | (uVar29 >= uVar35) * uVar35) == uVar29);
  auVar30._4_4_ = -(uint)(((uVar31 < uVar36) * uVar31 | (uVar31 >= uVar36) * uVar36) == uVar31);
  auVar30._8_4_ = -(uint)(((uVar32 < uVar37) * uVar32 | (uVar32 >= uVar37) * uVar37) == uVar32);
  auVar30._12_4_ = -(uint)(((uVar33 < uVar38) * uVar33 | (uVar33 >= uVar38) * uVar38) == uVar33);
  iVar10 = movmskps(in_EAX,auVar30);
  if ((((iVar10 != 0) || (4 < params.cParams.minMatch - 3)) ||
      (0x20000 < params.cParams.targetLength)) || (8 < params.cParams.strategy - ZSTD_fast)) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x89b3,
                  "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                 );
  }
  if (cdict != (ZSTD_CDict *)0x0 && dict != (void *)0x0) {
    __assert_fail("!((dict) && (cdict))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x89b4,
                  "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                 );
  }
  if (params.nbWorkers != (mtctx->params).nbWorkers) {
    iVar10 = POOL_resize(mtctx->factory,(ulong)(uint)params.nbWorkers);
    if (iVar10 != 0) {
      return 0xffffffffffffffc0;
    }
    local_108._0_4_ = iVar11 + 2;
    ZVar22 = mtctx->jobIDMask + ZSTD_f_zstd1_magicless;
    if (ZVar22 < (uint)local_108._0_4_) {
      ZVar7.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffe70;
      ZVar7.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffe68;
      ZVar7.opaque = in_stack_fffffffffffffe78;
      ZSTDMT_freeJobsTable(mtctx->jobs,ZVar22,ZVar7);
      mtctx->jobIDMask = 0;
      pZVar14 = ZSTDMT_createJobsTable((U32 *)local_108,mtctx->cMem);
      mtctx->jobs = pZVar14;
      if (pZVar14 == (ZSTDMT_jobDescription *)0x0) {
        return 0xffffffffffffffc0;
      }
      ZVar22 = local_108._0_4_ - ZSTD_f_zstd1_magicless;
      if ((local_108._0_4_ ^ ZVar22) <= ZVar22) {
        __assert_fail("(nbJobs != 0) && ((nbJobs & (nbJobs - 1)) == 0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8870,"size_t ZSTDMT_expandJobsTable(ZSTDMT_CCtx *, U32)");
      }
      mtctx->jobIDMask = ZVar22;
    }
    pZVar15 = ZSTDMT_expandBufferPool(mtctx->bufPool,iVar11 * 2 + 3);
    mtctx->bufPool = pZVar15;
    if (pZVar15 == (ZSTDMT_bufferPool *)0x0) {
      return 0xffffffffffffffc0;
    }
    pZVar16 = mtctx->cctxPool;
    if (pZVar16 == (ZSTDMT_CCtxPool *)0x0) {
      return 0xffffffffffffffc0;
    }
    if (pZVar16->totalCCtx < iVar11) {
      pvVar2 = (pZVar16->cMem).opaque;
      local_108._16_4_ = SUB84(pvVar2,0);
      local_108._20_4_ = (undefined4)((ulong)pvVar2 >> 0x20);
      p_Var5 = (pZVar16->cMem).customAlloc;
      p_Var4 = (pZVar16->cMem).customFree;
      local_108._0_4_ = SUB84(p_Var5,0);
      local_108._4_4_ = (undefined4)((ulong)p_Var5 >> 0x20);
      local_108._8_4_ = SUB84(p_Var4,0);
      local_108._12_4_ = (undefined4)((ulong)p_Var4 >> 0x20);
      ZSTDMT_freeCCtxPool(pZVar16);
      cMem.opaque._4_4_ = local_108._20_4_;
      cMem.opaque._0_4_ = local_108._16_4_;
      cMem.customAlloc._4_4_ = local_108._4_4_;
      cMem.customAlloc._0_4_ = local_108._0_4_;
      cMem.customFree._4_4_ = local_108._12_4_;
      cMem.customFree._0_4_ = local_108._8_4_;
      pZVar16 = ZSTDMT_createCCtxPool(iVar11,cMem);
      mtctx->cctxPool = pZVar16;
      if (pZVar16 == (ZSTDMT_CCtxPool *)0x0) {
        return 0xffffffffffffffc0;
      }
    }
    pZVar15 = ZSTDMT_expandBufferPool(mtctx->seqPool,iVar11);
    mtctx->seqPool = pZVar15;
    if (pZVar15 == (ZSTDMT_bufferPool *)0x0) {
      return 0xffffffffffffffc0;
    }
    iVar10 = 0;
    if (0 < iVar11) {
      iVar10 = iVar11;
    }
    if (0xff < iVar10) {
      iVar10 = 0x100;
    }
    if ((uint)iVar11 < 0x101) {
      iVar10 = iVar11;
    }
    (mtctx->params).nbWorkers = iVar10;
  }
  sVar12 = 0x80000;
  if ((params.jobSize - 1 < 0x7ffff) || (sVar12 = 0x40000000, 0x40000000 < params.jobSize)) {
    params.jobSize = sVar12;
  }
  sVar12 = params.jobSize;
  if (mtctx->allJobsCompleted == 0) {
    ZSTDMT_waitForAllJobsCompleted(mtctx);
    ZSTDMT_releaseAllJobResources(mtctx);
    mtctx->allJobsCompleted = 1;
  }
  memcpy(&mtctx->params,&params,0xd0);
  mtctx->frameContentSize = pledgedSrcSize;
  ZSTD_freeCDict(mtctx->cdictLocal);
  if (dict == (void *)0x0) {
    mtctx->cdictLocal = (ZSTD_CDict *)0x0;
    mtctx->cdict = cdict;
LAB_0018d9f1:
    if (9 < (uint)params.overlapLog) {
      __assert_fail("0 <= ovlog && ovlog <= 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x898d,"int ZSTDMT_overlapLog(int, ZSTD_strategy)");
    }
    if (params.overlapLog == 0) {
      iVar11 = 3;
      if (ZVar9 - ZSTD_lazy2 < 5) {
        iVar11 = *(int *)(&DAT_003095f0 + (ulong)(ZVar9 - ZSTD_lazy2) * 4);
      }
LAB_0018da41:
      iVar10 = uVar34 - iVar11;
    }
    else {
      if (params.overlapLog != 1) {
        iVar11 = 9 - params.overlapLog;
        goto LAB_0018da41;
      }
      iVar10 = 0;
      iVar11 = 8;
    }
    if (params.ldmParams.enableLdm == ZSTD_ps_enable) {
      uVar31 = (ZVar9 < ZSTD_btlazy2) + 2 + uVar23;
      uVar29 = 0x1e;
      if (uVar31 < 0x1e) {
        uVar29 = uVar31;
      }
      uVar31 = 0x15;
      if (0x15 < uVar29) {
        uVar31 = uVar29;
      }
      uVar29 = uVar31 - 2;
      if (uVar34 < uVar31 - 2) {
        uVar29 = uVar34;
      }
      uVar17 = 1L << ((char)uVar29 - (char)iVar11 & 0x3fU);
      mtctx->targetPrefixSize = uVar17;
      mtctx->targetSectionSize = sVar12;
      uVar24 = uVar17;
      if (sVar12 == 0) {
        uVar23 = (ZVar9 < ZSTD_btlazy2) + 2 + uVar23;
        bVar20 = 0x15;
        if (0x14 < uVar23) {
LAB_0018db03:
          bVar20 = 0x1e;
          if (uVar23 < 0x1e) {
            bVar20 = (byte)uVar23;
          }
        }
LAB_0018db0e:
        sVar12 = 1L << (bVar20 & 0x3f);
        mtctx->targetSectionSize = sVar12;
      }
    }
    else {
      uVar17 = 1L << ((byte)iVar10 & 0x3f);
      uVar24 = 0;
      if (iVar10 != 0) {
        uVar24 = uVar17;
      }
      mtctx->targetPrefixSize = uVar24;
      mtctx->targetSectionSize = sVar12;
      if (sVar12 == 0) {
        bVar20 = 0x14;
        if (0x11 < uVar34) {
          uVar23 = uVar34 + 2;
          goto LAB_0018db03;
        }
        goto LAB_0018db0e;
      }
    }
    if (params.rsyncable != 0) {
      uVar23 = (uint)(sVar12 >> 10);
      if (uVar23 == 0) {
        __assert_fail("jobSizeKB >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x89df,
                      "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                     );
      }
      uVar29 = 0x1f;
      if (uVar23 != 0) {
        for (; uVar23 >> uVar29 == 0; uVar29 = uVar29 - 1) {
        }
      }
      if (uVar29 < 9) {
        __assert_fail("rsyncBits >= RSYNC_MIN_BLOCK_LOG + 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x89e2,
                      "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                     );
      }
      (mtctx->rsync).hash = 0;
      (mtctx->rsync).hitMask = ~(-1L << (0x29 - ((byte)uVar29 ^ 0x1f) & 0x3f));
      (mtctx->rsync).primePower = 0xf5507fe35f91f8cb;
    }
    if (sVar12 < uVar24) {
      mtctx->targetSectionSize = uVar24;
      sVar12 = uVar17;
    }
    ppVar3 = (pthread_mutex_t *)mtctx->bufPool;
    uVar17 = 0;
    uVar24 = (ulong)(0x20000U - (int)sVar12 >> 0xb);
    if (0x1ffff < sVar12) {
      uVar24 = uVar17;
    }
    lVar21 = uVar24 + (sVar12 >> 8) + sVar12;
    lVar27 = -0x48;
    if (lVar21 != 0) {
      lVar27 = lVar21;
    }
    pthread_mutex_lock(ppVar3);
    ppVar3[1].__align = lVar27;
    pthread_mutex_unlock(ppVar3);
    if ((mtctx->params).ldmParams.enableLdm == ZSTD_ps_enable) {
      uVar17 = 1L << ((byte)(mtctx->params).cParams.windowLog & 0x3f);
    }
    sVar12 = mtctx->targetSectionSize;
    uVar23 = (mtctx->params).nbWorkers;
    uVar24 = 1;
    if (1 < (int)uVar23) {
      uVar24 = (ulong)uVar23;
    }
    uVar25 = uVar24 * sVar12;
    if (uVar24 * sVar12 < uVar17) {
      uVar25 = uVar17;
    }
    uVar25 = uVar25 + (3 - (ulong)(mtctx->targetPrefixSize == 0)) * sVar12;
    if ((mtctx->roundBuff).capacity < uVar25) {
      pBVar18 = (mtctx->roundBuff).buffer;
      if (pBVar18 != (BYTE *)0x0) {
        p_Var4 = (mtctx->cMem).customFree;
        if (p_Var4 == (ZSTD_freeFunction)0x0) {
          free(pBVar18);
        }
        else {
          (*p_Var4)((mtctx->cMem).opaque,pBVar18);
        }
      }
      p_Var5 = (mtctx->cMem).customAlloc;
      if (p_Var5 == (ZSTD_allocFunction)0x0) {
        pBVar18 = (BYTE *)malloc(uVar25);
      }
      else {
        pBVar18 = (BYTE *)(*p_Var5)((mtctx->cMem).opaque,uVar25);
      }
      (mtctx->roundBuff).buffer = pBVar18;
      if (pBVar18 == (BYTE *)0x0) {
        (mtctx->roundBuff).capacity = 0;
        goto LAB_0018e05c;
      }
      (mtctx->roundBuff).capacity = uVar25;
      sVar12 = mtctx->targetSectionSize;
    }
    uVar23 = 0;
    (mtctx->roundBuff).pos = 0;
    mtctx->doneJobID = 0;
    mtctx->nextJobID = 0;
    mtctx->frameEnded = 0;
    mtctx->allJobsCompleted = 0;
    mtctx->consumed = 0;
    mtctx->produced = 0;
    (mtctx->inBuff).prefix.start = (void *)0x0;
    (mtctx->inBuff).prefix.size = 0;
    (mtctx->inBuff).buffer.start = (void *)0x0;
    (mtctx->inBuff).buffer.capacity = 0;
    (mtctx->inBuff).filled = 0;
    ppVar3 = (pthread_mutex_t *)mtctx->seqPool;
    memcpy(local_108,&params,0xd0);
    if (local_a8._0_4_ == ZSTD_ps_enable) {
      ZSTD_ldm_adjustParameters
                ((ldmParams_t *)local_a8,(ZSTD_compressionParameters *)(local_108 + 4));
      if ((uint)local_a8._4_4_ < (uint)local_a8._8_4_) {
        __assert_fail("params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x86c9,
                      "int ZSTDMT_serialState_reset(serialState_t *, ZSTDMT_seqPool *, ZSTD_CCtx_params, size_t, const void *, const size_t, ZSTD_dictContentType_e)"
                     );
      }
      uVar23 = local_a8._8_4_;
      uVar29 = local_a8._4_4_;
      if (0x1f < (uint)local_98) {
        __assert_fail("params.ldmParams.hashRateLog < 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x86ca,
                      "int ZSTDMT_serialState_reset(serialState_t *, ZSTDMT_seqPool *, ZSTD_CCtx_params, size_t, const void *, const size_t, ZSTD_dictContentType_e)"
                     );
      }
    }
    else {
      local_a8 = (undefined1  [16])0x0;
      local_98._0_4_ = 0;
      local_98._4_4_ = 0;
      uVar29 = 0;
    }
    pvVar2 = local_60;
    p_Var4 = p_Stack_68;
    p_Var5 = local_70;
    (mtctx->serial).nextJobID = 0;
    if (local_108._36_4_ != 0) {
      (mtctx->serial).xxhState.total_len = 0;
      (mtctx->serial).xxhState.v[0] = 0;
      (mtctx->serial).xxhState.v[1] = 0;
      (mtctx->serial).xxhState.v[2] = 0;
      *(undefined1 (*) [16])((mtctx->serial).xxhState.v + 3) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((mtctx->serial).xxhState.mem64 + 3) = (undefined1  [16])0x0;
      (mtctx->serial).xxhState.mem64[1] = 0;
      (mtctx->serial).xxhState.mem64[2] = 0;
      (mtctx->serial).xxhState.reserved64 = 0;
      (mtctx->serial).xxhState.v[0] = 0x60ea27eeadc0b5d6;
      (mtctx->serial).xxhState.v[1] = 0xc2b2ae3d27d4eb4f;
      (mtctx->serial).xxhState.v[3] = 0x61c8864e7a143579;
    }
    if (local_a8._0_4_ == ZSTD_ps_enable) {
      __size = 8L << ((byte)uVar29 & 0x3f);
      UVar26 = (mtctx->serial).params.ldmParams.hashLog;
      UVar1 = (mtctx->serial).params.ldmParams.bucketSizeLog;
      __size_00 = 1L << ((byte)(uVar29 - uVar23) & 0x3f);
      uVar24 = (ulong)(uint)local_a8._12_4_;
      pthread_mutex_lock(ppVar3);
      ppVar3[1].__align = (sVar12 / uVar24) * 0xc;
      pthread_mutex_unlock(ppVar3);
      *(undefined8 *)&(mtctx->serial).ldmState.window.nbOverflowCorrections = 0;
      (mtctx->serial).ldmState.window.base = " ";
      (mtctx->serial).ldmState.window.dictBase = " ";
      (mtctx->serial).ldmState.window.dictLimit = 2;
      (mtctx->serial).ldmState.window.lowLimit = 2;
      (mtctx->serial).ldmState.window.nextSrc = (BYTE *)"BC7 709 Luma:            ";
      __ptr = (mtctx->serial).ldmState.hashTable;
      if (__ptr == (ldmEntry_t *)0x0) {
LAB_0018deeb:
        if (p_Var5 == (ZSTD_allocFunction)0x0) {
          __ptr = (ldmEntry_t *)malloc(__size);
        }
        else {
          __ptr = (ldmEntry_t *)(*p_Var5)(pvVar2,__size);
        }
        (mtctx->serial).ldmState.hashTable = __ptr;
      }
      else if ((mtctx->serial).params.ldmParams.hashLog < uVar29) {
        if (p_Var4 == (ZSTD_freeFunction)0x0) {
          free(__ptr);
        }
        else {
          (*p_Var4)(pvVar2,__ptr);
        }
        goto LAB_0018deeb;
      }
      pBVar18 = (mtctx->serial).ldmState.bucketOffsets;
      if ((pBVar18 == (BYTE *)0x0) || (plVar19 = __ptr, UVar26 - UVar1 < uVar29 - uVar23)) {
        if (pBVar18 != (BYTE *)0x0) {
          if (p_Var4 == (ZSTD_freeFunction)0x0) {
            free(pBVar18);
          }
          else {
            (*p_Var4)(pvVar2,pBVar18);
          }
        }
        if (p_Var5 == (ZSTD_allocFunction)0x0) {
          plVar19 = (ldmEntry_t *)malloc(__size_00);
        }
        else {
          plVar19 = (ldmEntry_t *)(*p_Var5)(pvVar2,__size_00);
        }
        (mtctx->serial).ldmState.bucketOffsets = (BYTE *)plVar19;
        __ptr = (mtctx->serial).ldmState.hashTable;
        if (__ptr == (ldmEntry_t *)0x0) goto LAB_0018e05c;
      }
      if (plVar19 == (ldmEntry_t *)0x0) goto LAB_0018e05c;
      ldmState = &(mtctx->serial).ldmState;
      memset(__ptr,0,__size);
      memset((mtctx->serial).ldmState.bucketOffsets,0,__size_00);
      (mtctx->serial).ldmState.loadedDictEnd = 0;
      if (dictContentType == ZSTD_dct_rawContent && dictSize != 0) {
        pBVar18 = (mtctx->serial).ldmState.window.base;
        if (pBVar18 == (BYTE *)0x0) {
          __assert_fail("window->base != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x48d8,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)"
                       );
        }
        pBVar28 = (mtctx->serial).ldmState.window.dictBase;
        if (pBVar28 == (BYTE *)0x0) {
          __assert_fail("window->dictBase != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x48d9,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)"
                       );
        }
        pBVar6 = (ldmState->window).nextSrc;
        if (pBVar6 == (BYTE *)dict) {
          uVar24 = (ulong)(mtctx->serial).ldmState.window.dictLimit;
          pBVar18 = pBVar28;
          uVar23 = (mtctx->serial).ldmState.window.lowLimit;
        }
        else {
          uVar24 = (long)pBVar6 - (long)pBVar18;
          uVar23 = (mtctx->serial).ldmState.window.dictLimit;
          (mtctx->serial).ldmState.window.lowLimit = uVar23;
          if (uVar24 >> 0x20 != 0) {
            __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x48e0,
                          "U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
          }
          uVar29 = (uint)uVar24;
          (mtctx->serial).ldmState.window.dictLimit = uVar29;
          (mtctx->serial).ldmState.window.dictBase = pBVar18;
          (mtctx->serial).ldmState.window.base = (BYTE *)((long)dict - uVar24);
          if (uVar29 - uVar23 < 8) {
            (mtctx->serial).ldmState.window.lowLimit = uVar29;
            uVar23 = uVar29;
          }
        }
        pBVar28 = (BYTE *)(dictSize + (long)dict);
        (ldmState->window).nextSrc = pBVar28;
        if ((pBVar18 + uVar23 < pBVar28) && (dict < pBVar18 + (uVar24 & 0xffffffff))) {
          UVar26 = (U32)((long)pBVar28 - (long)pBVar18);
          if ((long)(uVar24 & 0xffffffff) < (long)pBVar28 - (long)pBVar18) {
            UVar26 = (U32)uVar24;
          }
          (mtctx->serial).ldmState.window.lowLimit = UVar26;
        }
        ZSTD_ldm_fillHashTable(ldmState,(BYTE *)dict,pBVar28,(ldmParams_t *)local_a8);
        UVar26 = 0;
        if (local_108._48_4_ == 0) {
          UVar26 = (int)pBVar28 - *(int *)&(mtctx->serial).ldmState.window.base;
        }
        (mtctx->serial).ldmState.loadedDictEnd = UVar26;
      }
      uVar8 = *(undefined4 *)&(mtctx->serial).ldmState.window.field_0x24;
      (mtctx->serial).ldmWindow.nbOverflowCorrections =
           (mtctx->serial).ldmState.window.nbOverflowCorrections;
      *(undefined4 *)&(mtctx->serial).ldmWindow.field_0x24 = uVar8;
      pBVar18 = (ldmState->window).nextSrc;
      pBVar28 = (mtctx->serial).ldmState.window.base;
      UVar26 = (mtctx->serial).ldmState.window.dictLimit;
      UVar1 = (mtctx->serial).ldmState.window.lowLimit;
      (mtctx->serial).ldmWindow.dictBase = (mtctx->serial).ldmState.window.dictBase;
      (mtctx->serial).ldmWindow.dictLimit = UVar26;
      (mtctx->serial).ldmWindow.lowLimit = UVar1;
      (mtctx->serial).ldmWindow.nextSrc = pBVar18;
      (mtctx->serial).ldmWindow.base = pBVar28;
    }
    memcpy(&(mtctx->serial).params,local_108,0xd0);
    (mtctx->serial).params.jobSize = sVar12 & 0xffffffff;
    sVar12 = 0;
  }
  else {
    ZVar7 = mtctx->cMem;
    memset((ZSTD_CCtx_params *)local_108,0,0xd0);
    local_108._32_4_ = 1;
    local_108._28_4_ = params.cParams.strategy;
    local_108._24_4_ = params.cParams.targetLength;
    local_108._4_4_ = params.cParams.windowLog;
    local_108._8_4_ = params.cParams.chainLog;
    local_108._12_4_ = params.cParams.hashLog;
    local_108._16_4_ = params.cParams.searchLog;
    local_108._20_4_ = params.cParams.minMatch;
    local_70 = (mtctx->cMem).customAlloc;
    p_Stack_68 = (mtctx->cMem).customFree;
    local_60 = (mtctx->cMem).opaque;
    pZVar13 = ZSTD_createCDict_advanced2
                        (dict,dictSize,ZSTD_dlm_byCopy,dictContentType,(ZSTD_CCtx_params *)local_108
                         ,ZVar7);
    mtctx->cdictLocal = pZVar13;
    mtctx->cdict = pZVar13;
    if (pZVar13 != (ZSTD_CDict *)0x0) goto LAB_0018d9f1;
LAB_0018e05c:
    sVar12 = 0xffffffffffffffc0;
  }
  return sVar12;
}

Assistant:

size_t ZSTDMT_initCStream_internal(
        ZSTDMT_CCtx* mtctx,
        const void* dict, size_t dictSize, ZSTD_dictContentType_e dictContentType,
        const ZSTD_CDict* cdict, ZSTD_CCtx_params params,
        unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTDMT_initCStream_internal (pledgedSrcSize=%u, nbWorkers=%u, cctxPool=%u)",
                (U32)pledgedSrcSize, params.nbWorkers, mtctx->cctxPool->totalCCtx);

    /* params supposed partially fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    /* init */
    if (params.nbWorkers != mtctx->params.nbWorkers)
        FORWARD_IF_ERROR( ZSTDMT_resize(mtctx, params.nbWorkers) , "");

    if (params.jobSize != 0 && params.jobSize < ZSTDMT_JOBSIZE_MIN) params.jobSize = ZSTDMT_JOBSIZE_MIN;
    if (params.jobSize > (size_t)ZSTDMT_JOBSIZE_MAX) params.jobSize = (size_t)ZSTDMT_JOBSIZE_MAX;

    DEBUGLOG(4, "ZSTDMT_initCStream_internal: %u workers", params.nbWorkers);

    if (mtctx->allJobsCompleted == 0) {   /* previous compression not correctly finished */
        ZSTDMT_waitForAllJobsCompleted(mtctx);
        ZSTDMT_releaseAllJobResources(mtctx);
        mtctx->allJobsCompleted = 1;
    }

    mtctx->params = params;
    mtctx->frameContentSize = pledgedSrcSize;
    if (dict) {
        ZSTD_freeCDict(mtctx->cdictLocal);
        mtctx->cdictLocal = ZSTD_createCDict_advanced(dict, dictSize,
                                                    ZSTD_dlm_byCopy, dictContentType, /* note : a loadPrefix becomes an internal CDict */
                                                    params.cParams, mtctx->cMem);
        mtctx->cdict = mtctx->cdictLocal;
        if (mtctx->cdictLocal == NULL) return ERROR(memory_allocation);
    } else {
        ZSTD_freeCDict(mtctx->cdictLocal);
        mtctx->cdictLocal = NULL;
        mtctx->cdict = cdict;
    }

    mtctx->targetPrefixSize = ZSTDMT_computeOverlapSize(&params);
    DEBUGLOG(4, "overlapLog=%i => %u KB", params.overlapLog, (U32)(mtctx->targetPrefixSize>>10));
    mtctx->targetSectionSize = params.jobSize;
    if (mtctx->targetSectionSize == 0) {
        mtctx->targetSectionSize = 1ULL << ZSTDMT_computeTargetJobLog(&params);
    }
    assert(mtctx->targetSectionSize <= (size_t)ZSTDMT_JOBSIZE_MAX);

    if (params.rsyncable) {
        /* Aim for the targetsectionSize as the average job size. */
        U32 const jobSizeKB = (U32)(mtctx->targetSectionSize >> 10);
        U32 const rsyncBits = (assert(jobSizeKB >= 1), ZSTD_highbit32(jobSizeKB) + 10);
        /* We refuse to create jobs < RSYNC_MIN_BLOCK_SIZE bytes, so make sure our
         * expected job size is at least 4x larger. */
        assert(rsyncBits >= RSYNC_MIN_BLOCK_LOG + 2);
        DEBUGLOG(4, "rsyncLog = %u", rsyncBits);
        mtctx->rsync.hash = 0;
        mtctx->rsync.hitMask = (1ULL << rsyncBits) - 1;
        mtctx->rsync.primePower = ZSTD_rollingHash_primePower(RSYNC_LENGTH);
    }
    if (mtctx->targetSectionSize < mtctx->targetPrefixSize) mtctx->targetSectionSize = mtctx->targetPrefixSize;  /* job size must be >= overlap size */
    DEBUGLOG(4, "Job Size : %u KB (note : set to %u)", (U32)(mtctx->targetSectionSize>>10), (U32)params.jobSize);
    DEBUGLOG(4, "inBuff Size : %u KB", (U32)(mtctx->targetSectionSize>>10));
    ZSTDMT_setBufferSize(mtctx->bufPool, ZSTD_compressBound(mtctx->targetSectionSize));
    {
        /* If ldm is enabled we need windowSize space. */
        size_t const windowSize = mtctx->params.ldmParams.enableLdm == ZSTD_ps_enable ? (1U << mtctx->params.cParams.windowLog) : 0;
        /* Two buffers of slack, plus extra space for the overlap
         * This is the minimum slack that LDM works with. One extra because
         * flush might waste up to targetSectionSize-1 bytes. Another extra
         * for the overlap (if > 0), then one to fill which doesn't overlap
         * with the LDM window.
         */
        size_t const nbSlackBuffers = 2 + (mtctx->targetPrefixSize > 0);
        size_t const slackSize = mtctx->targetSectionSize * nbSlackBuffers;
        /* Compute the total size, and always have enough slack */
        size_t const nbWorkers = MAX(mtctx->params.nbWorkers, 1);
        size_t const sectionsSize = mtctx->targetSectionSize * nbWorkers;
        size_t const capacity = MAX(windowSize, sectionsSize) + slackSize;
        if (mtctx->roundBuff.capacity < capacity) {
            if (mtctx->roundBuff.buffer)
                ZSTD_customFree(mtctx->roundBuff.buffer, mtctx->cMem);
            mtctx->roundBuff.buffer = (BYTE*)ZSTD_customMalloc(capacity, mtctx->cMem);
            if (mtctx->roundBuff.buffer == NULL) {
                mtctx->roundBuff.capacity = 0;
                return ERROR(memory_allocation);
            }
            mtctx->roundBuff.capacity = capacity;
        }
    }
    DEBUGLOG(4, "roundBuff capacity : %u KB", (U32)(mtctx->roundBuff.capacity>>10));
    mtctx->roundBuff.pos = 0;
    mtctx->inBuff.buffer = g_nullBuffer;
    mtctx->inBuff.filled = 0;
    mtctx->inBuff.prefix = kNullRange;
    mtctx->doneJobID = 0;
    mtctx->nextJobID = 0;
    mtctx->frameEnded = 0;
    mtctx->allJobsCompleted = 0;
    mtctx->consumed = 0;
    mtctx->produced = 0;
    if (ZSTDMT_serialState_reset(&mtctx->serial, mtctx->seqPool, params, mtctx->targetSectionSize,
                                 dict, dictSize, dictContentType))
        return ERROR(memory_allocation);
    return 0;
}